

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.h
# Opt level: O0

_Node * __thiscall
skiwi::
combinable<std::vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>_>
::_AddLocalItem(combinable<std::vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>_>
                *this,uint64_t _Key,size_t _Index)

{
  size_t _Key_00;
  bool bVar1;
  _Node *this_00;
  __pointer_type local_58;
  _Node *_TopNode;
  vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>
  local_40;
  _Node *local_28;
  _Node *_NewNode;
  size_t _Index_local;
  uint64_t _Key_local;
  combinable<std::vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>_>
  *this_local;
  
  _NewNode = (_Node *)_Index;
  _Index_local = _Key;
  _Key_local = (uint64_t)this;
  this_00 = (_Node *)operator_new(0x40);
  _Key_00 = _Index_local;
  _TopNode._3_1_ = 1;
  std::
  function<std::vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>_()>
  ::operator()(&local_40,&this->_M_fnInitialize);
  _Node::_Node(this_00,_Key_00,&local_40);
  _TopNode._3_1_ = 0;
  std::
  vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>
  ::~vector(&local_40);
  local_28 = this_00;
  do {
    local_58 = std::atomic::operator_cast_to__Node_((atomic *)(this->_M_buckets + (long)_NewNode));
    local_28->_M_chain = local_58;
    bVar1 = std::
            atomic<skiwi::combinable<std::vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>_>::_Node_*>
            ::compare_exchange_strong
                      (this->_M_buckets + (long)_NewNode,&local_58,local_28,memory_order_seq_cst);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return local_28;
}

Assistant:

_Node* _AddLocalItem(uint64_t _Key, size_t _Index)
      {
      _Node* _NewNode = new _Node(_Key, _M_fnInitialize());
      _Node* _TopNode;
      do
        {
        _TopNode = _M_buckets[_Index];
        _NewNode->_M_chain = _TopNode;
        } //while (_InterlockedCompareExchangePointer(reinterpret_cast<void * volatile *>(&_M_buckets[_Index]), _NewNode, _TopNode) != _TopNode);
      while (!_M_buckets[_Index].compare_exchange_strong(_TopNode, _NewNode));
        return _NewNode;
      }